

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

XSAnnotation * __thiscall
xercesc_4_0::TraverseSchema::traverseAnnotationDecl
          (TraverseSchema *this,DOMElement *annotationElem,
          ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList,bool topLevel)

{
  XMLBuffer *this_00;
  GeneralAttributeCheck *this_01;
  XMLSize_t XVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DOMNode *node;
  undefined4 extraout_var;
  long *plVar7;
  XMLCh *pXVar8;
  undefined4 extraout_var_01;
  DOMNode **ppDVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  XSAnnotation *this_02;
  TraverseSchema *this_03;
  XMLSize_t i;
  XMLSize_t getAt;
  NamespaceScopeManager nsMgr;
  undefined4 extraout_var_00;
  
  NamespaceScopeManager::NamespaceScopeManager(&nsMgr,annotationElem,this->fSchemaInfo,this);
  this_01 = &this->fAttributeCheck;
  GeneralAttributeCheck::checkAttributes
            (this_01,annotationElem,1,this,topLevel,(ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
  node = &XUtil::getFirstChildElement(&annotationElem->super_DOMNode)->super_DOMNode;
  if (node == (DOMNode *)0x0) {
    iVar4 = (*(annotationElem->super_DOMNode)._vptr_DOMNode[7])(annotationElem);
    plVar7 = (long *)CONCAT44(extraout_var_07,iVar4);
    if ((plVar7 != (long *)0x0) && (iVar4 = (**(code **)(*plVar7 + 0x20))(plVar7), iVar4 == 3)) {
      pXVar8 = (XMLCh *)(**(code **)(*plVar7 + 0x140))(plVar7);
      goto LAB_0030ff5d;
    }
  }
  else {
    pXVar8 = (XMLCh *)0x0;
    for (; node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
      iVar4 = (*node->_vptr_DOMNode[0x18])(node);
      bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar4),
                                (XMLCh *)SchemaSymbols::fgELT_APPINFO);
      if (bVar3) {
        iVar4 = (*node->_vptr_DOMNode[7])(node);
        plVar7 = (long *)CONCAT44(extraout_var_00,iVar4);
        if ((plVar7 != (long *)0x0) && (iVar4 = (**(code **)(*plVar7 + 0x20))(plVar7), iVar4 == 3))
        {
          pXVar8 = (XMLCh *)(**(code **)(*plVar7 + 0x140))(plVar7);
        }
        GeneralAttributeCheck::checkAttributes
                  (this_01,(DOMElement *)node,4,this,false,
                   (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
      }
      else {
        bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar4),
                                  (XMLCh *)SchemaSymbols::fgELT_DOCUMENTATION);
        if (bVar3) {
          iVar4 = (*node->_vptr_DOMNode[7])(node);
          plVar7 = (long *)CONCAT44(extraout_var_01,iVar4);
          if ((plVar7 != (long *)0x0) && (iVar4 = (**(code **)(*plVar7 + 0x20))(plVar7), iVar4 == 3)
             ) {
            pXVar8 = (XMLCh *)(**(code **)(*plVar7 + 0x140))(plVar7);
          }
          GeneralAttributeCheck::checkAttributes
                    (this_01,(DOMElement *)node,0xe,this,false,
                     (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0);
        }
        else {
          reportSchemaError(this,(DOMElement *)node,(XMLCh *)XMLUni::fgXMLErrDomain,0x90);
        }
      }
    }
LAB_0030ff5d:
    if ((pXVar8 != (XMLCh *)0x0) && (this->fScanner->fIgnoreAnnotations == false)) {
      XVar1 = nonXSAttList->fCurCount;
      if (XVar1 == 0) {
        this_02 = (XSAnnotation *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
        XSAnnotation::XSAnnotation(this_02,pXVar8,this->fGrammarPoolMemoryManager);
      }
      else {
        iVar4 = XMLString::patternMatch(pXVar8,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
        if (iVar4 == -1) goto LAB_003100bb;
        this_00 = &this->fBuffer;
        XMLBuffer::set(this_00,pXVar8,(long)(iVar4 + 10));
        for (getAt = 0; XVar1 != getAt; getAt = getAt + 1) {
          ppDVar9 = ValueVectorOf<xercesc_4_0::DOMNode_*>::elementAt(nonXSAttList,getAt);
          this_03 = (TraverseSchema *)*ppDVar9;
          iVar5 = (*(*(_func_int ***)this_03)[0x16])(this_03);
          iVar6 = (*(*(_func_int ***)this_03)[0x18])(this_03);
          iVar5 = (*(annotationElem->super_DOMNode)._vptr_DOMNode[0x30])
                            (annotationElem,CONCAT44(extraout_var_02,iVar5),
                             CONCAT44(extraout_var_03,iVar6));
          bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_04,iVar5),L"");
          if (bVar3) {
            XMLBuffer::append(this_00,L' ');
            iVar5 = (*(*(_func_int ***)this_03)[2])(this_03);
            XMLBuffer::append(this_00,(XMLCh *)CONCAT44(extraout_var_05,iVar5));
            XMLBuffer::append(this_00,L'=');
            XMLBuffer::append(this_00,L'\"');
            iVar5 = (*(*(_func_int ***)this_03)[3])();
            processAttValue(this_03,(XMLCh *)CONCAT44(extraout_var_06,iVar5),this_00);
            XMLBuffer::append(this_00,L'\"');
          }
        }
        XMLBuffer::append(this_00,pXVar8 + (long)iVar4 + 10);
        this_02 = (XSAnnotation *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
        pXVar8 = (this->fBuffer).fBuffer;
        pXVar8[(this->fBuffer).fIndex] = L'\0';
        XSAnnotation::XSAnnotation(this_02,pXVar8,this->fGrammarPoolMemoryManager);
      }
      pp_Var2 = annotationElem[0x17].super_DOMNode._vptr_DOMNode;
      this_02->fLine = (XMLFileLoc)annotationElem[0x16].super_DOMNode._vptr_DOMNode;
      this_02->fCol = (XMLFileLoc)pp_Var2;
      XSAnnotation::setSystemId(this_02,this->fSchemaInfo->fCurrentSchemaURL);
      goto LAB_003100be;
    }
  }
LAB_003100bb:
  this_02 = (XSAnnotation *)0x0;
LAB_003100be:
  NamespaceScopeManager::~NamespaceScopeManager(&nsMgr);
  return this_02;
}

Assistant:

XSAnnotation*
TraverseSchema::traverseAnnotationDecl(const DOMElement* const annotationElem,
                                       ValueVectorOf<DOMNode*>* const nonXSAttList,
                                       const bool topLevel) {

    NamespaceScopeManager nsMgr(annotationElem, fSchemaInfo, this);
    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        annotationElem, GeneralAttributeCheck::E_Annotation, this, topLevel
    );

    const XMLCh* contents = 0;
    DOMElement* child = XUtil::getFirstChildElement(annotationElem);
    if (child) {
        for (;
             child != 0;
             child = XUtil::getNextSiblingElement(child)) {

            const XMLCh* name = child->getLocalName();

            if (XMLString::equals(name, SchemaSymbols::fgELT_APPINFO)) {

                DOMNode* textContent = child->getFirstChild();
                if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
                    contents = ((DOMText*) textContent)->getData();

                fAttributeCheck.checkAttributes(child, GeneralAttributeCheck::E_Appinfo, this);
            }
            else if (XMLString::equals(name, SchemaSymbols::fgELT_DOCUMENTATION)) {

                DOMNode* textContent = child->getFirstChild();
                if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
                    contents = ((DOMText*) textContent)->getData();

                fAttributeCheck.checkAttributes(child, GeneralAttributeCheck::E_Documentation, this);
            }
            else {
                reportSchemaError(child, XMLUni::fgXMLErrDomain, XMLErrs::InvalidAnnotationContent);
            }
        }
    }
    else
    {
        // If the Annotation has no children, get the text directly
        DOMNode* textContent = annotationElem->getFirstChild();
        if (textContent && textContent->getNodeType() == DOMNode::TEXT_NODE)
            contents = ((DOMText*) textContent)->getData();
    }

    if (contents && !fScanner->getIgnoreAnnotations())
    {
        XSAnnotation* theAnnotation = 0;

        XMLSize_t nonXSAttSize = nonXSAttList->size();

        if (nonXSAttSize)
        {
            int annotTokenStart = XMLString::patternMatch(
                contents, SchemaSymbols::fgELT_ANNOTATION);

            if (annotTokenStart == -1) // something is wrong
                return 0;

            // set annotation element
            fBuffer.set(contents, annotTokenStart + 10);

            for (XMLSize_t i=0; i<nonXSAttSize; i++)
            {
                DOMNode* attNode = nonXSAttList->elementAt(i);

                if (!XMLString::equals(
                        annotationElem->getAttributeNS(
                           attNode->getNamespaceURI(), attNode->getLocalName())
                        , XMLUni::fgZeroLenString)
                   )
                {
                    continue;
                }

                fBuffer.append(chSpace);
                fBuffer.append(attNode->getNodeName());
                fBuffer.append(chEqual);
                fBuffer.append(chDoubleQuote);
                processAttValue(attNode->getNodeValue(), fBuffer);
                fBuffer.append(chDoubleQuote);
            }

            // add remaining annotation content
            fBuffer.append(contents + annotTokenStart + 10);

            theAnnotation = new (fGrammarPoolMemoryManager) XSAnnotation(fBuffer.getRawBuffer(), fGrammarPoolMemoryManager);
        }
        else
        {
            theAnnotation = new (fGrammarPoolMemoryManager) XSAnnotation(contents, fGrammarPoolMemoryManager);
        }

        /***
         * set line, col and systemId info
        ***/
        theAnnotation->setLineCol(
                                  ((XSDElementNSImpl*)annotationElem)->getLineNo()
                                , ((XSDElementNSImpl*)annotationElem)->getColumnNo()
                                 );
        theAnnotation->setSystemId(fSchemaInfo->getCurrentSchemaURL());

        return theAnnotation;
    }

    return 0;
}